

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O2

FT_Error ft_new_glyph(FT_Library library,FT_Glyph_Class *clazz,FT_Glyph *aglyph)

{
  FT_Memory memory;
  FT_Glyph pFVar1;
  int local_2c [2];
  FT_Error error;
  
  memory = library->memory;
  *aglyph = (FT_Glyph)0x0;
  pFVar1 = (FT_Glyph)ft_mem_alloc(memory,clazz->glyph_size,local_2c);
  if (local_2c[0] == 0) {
    pFVar1->library = library;
    pFVar1->clazz = clazz;
    pFVar1->format = clazz->glyph_format;
    *aglyph = pFVar1;
  }
  return local_2c[0];
}

Assistant:

static FT_Error
   ft_new_glyph( FT_Library             library,
                 const FT_Glyph_Class*  clazz,
                 FT_Glyph*              aglyph )
   {
     FT_Memory  memory = library->memory;
     FT_Error   error;
     FT_Glyph   glyph  = NULL;


     *aglyph = NULL;

     if ( !FT_ALLOC( glyph, clazz->glyph_size ) )
     {
       glyph->library = library;
       glyph->clazz   = clazz;
       glyph->format  = clazz->glyph_format;

       *aglyph = glyph;
     }

     return error;
   }